

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void delay_set_areg(DisasContext_conflict2 *s,uint regno,TCGv_i32 val,_Bool give_temp)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 ret;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (((uint)s->writeback_mask >> (regno & 0x1f) & 1) == 0) {
    s->writeback_mask = s->writeback_mask | 1 << ((byte)regno & 0x1f);
    if (!give_temp) {
      ret = tcg_temp_new_i32(tcg_ctx);
      s->writeback[regno] = ret;
      goto LAB_0067e918;
    }
    s->writeback[regno] = val;
  }
  else {
    ret = s->writeback[regno];
    if (!give_temp) {
LAB_0067e918:
      tcg_gen_mov_i32(tcg_ctx,ret,val);
      return;
    }
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    s->writeback[regno] = val;
  }
  return;
}

Assistant:

static void delay_set_areg(DisasContext *s, unsigned regno,
                           TCGv val, bool give_temp)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    if (s->writeback_mask & (1 << regno)) {
        if (give_temp) {
            tcg_temp_free(tcg_ctx, s->writeback[regno]);
            s->writeback[regno] = val;
        } else {
            tcg_gen_mov_i32(tcg_ctx, s->writeback[regno], val);
        }
    } else {
        s->writeback_mask |= 1 << regno;
        if (give_temp) {
            s->writeback[regno] = val;
        } else {
            TCGv tmp = tcg_temp_new(tcg_ctx);
            s->writeback[regno] = tmp;
            tcg_gen_mov_i32(tcg_ctx, tmp, val);
        }
    }
}